

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_every(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int special)

{
  JSShape *sh;
  JSValue new_target;
  JSValue this_obj;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  JSValueUnion JVar4;
  double dVar5;
  int64_t iVar6;
  int64_t iVar7;
  JSValueUnion JVar8;
  JSValueUnion *pJVar9;
  ulong uVar10;
  double idx;
  bool bVar11;
  JSValue v;
  JSValue this_val_00;
  JSValue func_obj;
  JSValue this_val_01;
  JSValue v_00;
  JSValue JVar12;
  JSValue JVar13;
  JSValue len_val;
  int64_t len;
  JSValueUnion local_100;
  JSValueUnion local_f0;
  JSValueUnion local_d0;
  int64_t iStack_c8;
  int64_t local_c0;
  ulong local_b8;
  JSValueUnion local_b0;
  ulong local_a8;
  JSValueUnion local_a0;
  JSValueUnion *local_98;
  JSValue local_90;
  ulong local_80;
  int64_t local_78;
  JSValueUnion local_70;
  JSValueUnion local_68;
  int64_t iStack_60;
  double local_58;
  undefined8 local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  JVar4._4_4_ = 0;
  JVar4.int32 = argc;
  JVar8 = this_val.u;
  local_100._4_4_ = 0;
  local_100.int32 = argc;
  local_d0.ptr = (void *)(local_d0 << 0x20);
  iStack_c8 = 3;
  local_b0.int32 = special;
  pJVar9 = &argv->u;
  if ((special & 8U) == 0) {
    this_val = JS_ToObject(ctx,this_val);
    JVar4 = (JSValueUnion)this_val.tag;
    iVar2 = js_get_length64(ctx,(int64_t *)&local_a8,this_val);
    if (iVar2 != 0) goto LAB_00164ea7;
LAB_00164ee7:
    JVar8 = (JSValueUnion)(argv->u).ptr;
    iVar6 = argv->tag;
    if (argc < 2) {
      local_98 = (JSValueUnion *)0x3;
      local_b8 = 0;
      local_a0.float64 = 0.0;
    }
    else {
      local_98 = (JSValueUnion *)argv[1].tag;
      JVar4.ptr = argv[1].u.ptr & 0xffffffff00000000;
      local_b8 = (ulong)argv[1].u.ptr & 0xffffffff;
      local_a0.ptr = JVar4.ptr;
    }
    iVar2 = JVar4.int32;
    iVar3 = check_function(ctx,*argv);
    JVar1.tag = local_40;
    JVar1.u.ptr = local_48.ptr;
    JVar13 = (JSValue)(ZEXT816(3) << 0x40);
    local_100 = JVar8;
    if (iVar3 != 0) goto LAB_00164f76;
    JVar4.float64 = 0.0;
    iVar7 = 3;
    local_100.float64 = local_b0.float64 & 0xffffffff;
    uVar10 = (ulong)local_b0.ptr & 0xffffffff;
    local_78 = iVar6;
    local_70 = JVar8;
    if ((uint)local_b0._0_4_ < 0xd) {
      iVar2 = (&switchD_00165062::switchdataD_0017cdf4)[uVar10] + 0x17cdf4;
      switch(uVar10) {
      case 0:
      case 8:
        JVar4.float64 = 4.94065645841247e-324;
      case 1:
      case 9:
        iVar7 = 1;
      default:
        local_100.float64 = (double)&switchD_00165062::switchdataD_0017cdf4;
        goto LAB_00165074;
      case 3:
        bVar11 = (long)(int)local_a8 == local_a8;
        JVar4.float64 = (double)(long)local_a8;
        if (bVar11) {
          JVar4.ptr = (void *)(local_a8 & 0xffffffff);
        }
        pJVar9 = (JSValueUnion *)0x7;
        if (bVar11) {
          pJVar9 = (JSValueUnion *)0x0;
        }
        break;
      case 4:
        JVar4.float64 = 0.0;
        pJVar9 = (JSValueUnion *)0x0;
        break;
      case 0xb:
        local_58 = (double)(local_a8 & 0xffffffff);
        local_50 = 0;
        this_val_00.tag = (int64_t)&local_68;
        this_val_00.u.float64 = 9.88131291682493e-324;
        _local_68 = this_val;
        JVar13 = js_typed_array___speciesCreate(ctx,this_val_00,iVar2,(JSValue *)pJVar9);
        goto LAB_0016513a;
      case 0xc:
        sh = ctx->array_shape;
        (sh->header).ref_count = (sh->header).ref_count + 1;
        JVar13 = JS_NewObjectFromShape(ctx,sh,2);
        JVar1.tag = local_40;
        JVar1.u.ptr = local_48.ptr;
        JVar4 = JVar13.u;
        iVar3 = (int)JVar13.tag;
        goto joined_r0x001650f6;
      }
      len_val.tag = (int64_t)pJVar9;
      len_val.u.float64 = JVar4.float64;
      JVar13 = JS_ArraySpeciesCreate(ctx,this_val,len_val);
      iVar2 = JVar4.int32;
LAB_0016513a:
      JVar1.tag = local_40;
      JVar1.u.ptr = local_48.ptr;
      JVar4 = JVar13.u;
      iVar3 = (int)JVar13.tag;
joined_r0x001650f6:
      local_100.float64 = JVar4.float64 >> 0x20;
      if (iVar3 == 6) goto LAB_00164f76;
    }
    else {
LAB_00165074:
      JVar13.tag = iVar7;
      JVar13.u.float64 = JVar4.float64;
    }
    JVar4 = JVar13.u;
    if (0 < (long)local_a8) {
      local_a0.float64 = local_a0.float64 | local_b8;
      local_b8 = (ulong)JVar4.ptr & 0xffffffff | (long)local_100.ptr << 0x20;
      idx = 0.0;
      local_80 = uVar10;
      do {
        if (((ulong)local_b0.ptr & 8) == 0) {
          pJVar9 = &local_d0;
          dVar5 = idx;
          iVar3 = JS_TryGetPropertyInt64(ctx,this_val,(int64_t)idx,(JSValue *)pJVar9);
          iVar2 = SUB84(dVar5,0);
          JVar1 = _local_48;
          if (iVar3 < 0) goto LAB_00164f76;
        }
        else {
          dVar5 = idx;
          _local_d0 = JS_GetPropertyInt64(ctx,this_val,(int64_t)idx);
          iVar2 = SUB84(dVar5,0);
          iVar3 = 1;
          JVar1 = _local_48;
          if (local_d0._8_4_ == 6) goto LAB_00164f76;
        }
        if (iVar3 != 0) {
          bVar11 = (ulong)idx >> 0x1f == 0;
          local_58 = (double)(long)idx;
          if (bVar11) {
            local_58 = idx;
          }
          local_50 = 7;
          if (bVar11) {
            local_50 = 0;
          }
          local_68 = local_d0;
          iStack_60 = iStack_c8;
          local_f0.float64 = local_f0.float64 & 0xffffffff00000000;
          this_obj.tag = (int64_t)local_98;
          this_obj.u.float64 = local_a0.float64;
          new_target.tag = 3;
          new_target.u.ptr = local_f0.ptr;
          func_obj.tag = local_78;
          func_obj.u.float64 = local_70.float64;
          JVar8 = local_a0;
          pJVar9 = local_98;
          _local_48 = this_val;
          local_90 = JS_CallInternal(ctx,func_obj,this_obj,new_target,3,(JSValue *)&local_68,2);
          iVar2 = JVar8.int32;
          JVar1 = _local_48;
          if ((uint)local_90.tag == 6) goto LAB_00164f76;
          if ((uint)local_b0._0_4_ < 0xd) {
            JVar13 = (JSValue)(*(code *)(&DAT_0017ce28 + *(int *)(&DAT_0017ce28 + local_80 * 4)))();
            return JVar13;
          }
          if (0xfffffff4 < (uint)local_90.tag) {
            iVar2 = *local_90.u.ptr;
            *(int *)local_90.u.ptr = iVar2 + -1;
            if (iVar2 < 2) {
              __JS_FreeValueRT(ctx->rt,local_90);
            }
          }
          local_f0.float64 = local_d0.float64;
          if (0xfffffff4 < local_d0._8_4_) {
            iVar2 = *local_d0.ptr;
            *(int *)local_d0.ptr = iVar2 + -1;
            if (iVar2 < 2) {
              __JS_FreeValueRT(ctx->rt,_local_d0);
            }
          }
          local_d0.ptr = (void *)(local_d0 << 0x20);
          iStack_c8 = 3;
        }
        idx = (double)((long)idx + 1);
      } while ((long)idx < (long)local_a8);
    }
    iVar6 = JVar13.tag;
    if (local_b0._0_4_ == 0xc) {
      local_50 = 0;
      this_val_01.tag = (int64_t)&local_68;
      this_val_01.u.float64 = 9.88131291682493e-324;
      local_58 = 0.0;
      _local_68 = this_val;
      JVar13 = js_typed_array___speciesCreate(ctx,this_val_01,iVar2,(JSValue *)pJVar9);
      iVar7 = JVar13.tag;
      if ((int)JVar13.tag == 6) {
LAB_00165609:
        iVar7 = iVar6;
        bVar11 = false;
      }
      else {
        JVar8.ptr = (void *)((ulong)JVar4.ptr & 0xffffffff | (long)local_100.ptr << 0x20);
        local_c0 = iVar6;
        local_b0 = JVar13.u;
        local_68.ptr = JVar8.ptr;
        iStack_60 = iVar6;
        local_90 = JS_Invoke(ctx,JVar13,0x42,1,(JSValue *)&local_68);
        iVar2 = check_exception_free(ctx,local_90);
        iVar6 = local_c0;
        if (iVar2 != 0) goto LAB_00165609;
        v_00.tag = local_c0;
        v_00.u.ptr = JVar8.ptr;
        JS_FreeValue(ctx,v_00);
        local_100.float64 = local_b0.float64 >> 0x20;
        bVar11 = true;
        JVar4.float64 = local_b0.float64 & 0xffffffff;
      }
      JVar13.tag = iVar7;
      JVar13.u.ptr = JVar4.ptr;
      JVar1 = _local_48;
      if (!bVar11) goto LAB_00164f76;
    }
    iVar6 = JVar13.tag;
    if ((0xfffffff4 < local_d0._8_4_) &&
       (iVar2 = *local_d0.ptr, *(int *)local_d0.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,_local_d0);
    }
    if ((0xfffffff4 < (uint)this_val.tag) &&
       (iVar2 = *this_val.u.ptr, *(int *)this_val.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,this_val);
    }
    JVar4.ptr = (void *)((ulong)JVar13.u.ptr & 0xffffffff | (long)local_100.ptr << 0x20);
  }
  else {
    if (0xfffffff4 < (uint)this_val.tag) {
      *(int *)JVar8.ptr = *JVar8.ptr + 1;
    }
    local_68 = JVar8;
    iVar2 = js_typed_array_get_length_internal(ctx,this_val);
    local_a8 = (ulong)iVar2;
    if (-1 < iVar2) goto LAB_00164ee7;
LAB_00164ea7:
    JVar1.tag = local_40;
    JVar1.u.ptr = local_48.ptr;
    JVar13 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00164f76:
    JVar4.ptr = (void *)((ulong)JVar13.u.ptr & 0xffffffff | (long)local_100.ptr << 0x20);
    _local_48 = JVar1;
    if ((0xfffffff4 < (uint)JVar13.tag) &&
       (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
      v.tag = JVar13.tag;
      v.u.ptr = JVar4.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
    if ((0xfffffff4 < local_d0._8_4_) &&
       (iVar2 = *local_d0.ptr, *(int *)local_d0.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,_local_d0);
    }
    if ((0xfffffff4 < (uint)this_val.tag) &&
       (iVar2 = *this_val.u.ptr, *(int *)this_val.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,this_val);
    }
    iVar6 = 6;
    JVar4.float64 = 0.0;
  }
  JVar12.tag = iVar6;
  JVar12.u.float64 = JVar4.float64;
  return JVar12;
}

Assistant:

static JSValue js_array_every(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int special)
{
    JSValue obj, val, index_val, res, ret;
    JSValueConst args[3];
    JSValueConst func, this_arg;
    int64_t len, k, n;
    int present;

    ret = JS_UNDEFINED;
    val = JS_UNDEFINED;
    if (special & special_TA) {
        obj = JS_DupValue(ctx, this_val);
        len = js_typed_array_get_length_internal(ctx, obj);
        if (len < 0)
            goto exception;
    } else {
        obj = JS_ToObject(ctx, this_val);
        if (js_get_length64(ctx, &len, obj))
            goto exception;
    }
    func = argv[0];
    this_arg = JS_UNDEFINED;
    if (argc > 1)
        this_arg = argv[1];
        
    if (check_function(ctx, func))
        goto exception;

    switch (special) {
    case special_every:
    case special_every | special_TA:
        ret = JS_TRUE;
        break;
    case special_some:
    case special_some | special_TA:
        ret = JS_FALSE;
        break;
    case special_map:
        /* XXX: JS_ArraySpeciesCreate should take int64_t */
        ret = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt64(ctx, len));
        if (JS_IsException(ret))
            goto exception;
        break;
    case special_filter:
        ret = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt32(ctx, 0));
        if (JS_IsException(ret))
            goto exception;
        break;
    case special_map | special_TA:
        args[0] = obj;
        args[1] = JS_NewInt32(ctx, len);
        ret = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 2, args);
        if (JS_IsException(ret))
            goto exception;
        break;
    case special_filter | special_TA:
        ret = JS_NewArray(ctx);
        if (JS_IsException(ret))
            goto exception;
        break;
    }
    n = 0;

    for(k = 0; k < len; k++) {
        if (special & special_TA) {
            val = JS_GetPropertyInt64(ctx, obj, k);
            if (JS_IsException(val))
                goto exception;
            present = TRUE;
        } else {
            present = JS_TryGetPropertyInt64(ctx, obj, k, &val);
            if (present < 0)
                goto exception;
        }
        if (present) {
            index_val = JS_NewInt64(ctx, k);
            if (JS_IsException(index_val))
                goto exception;
            args[0] = val;
            args[1] = index_val;
            args[2] = obj;
            res = JS_Call(ctx, func, this_arg, 3, args);
            JS_FreeValue(ctx, index_val);
            if (JS_IsException(res))
                goto exception;
            switch (special) {
            case special_every:
            case special_every | special_TA:
                if (!JS_ToBoolFree(ctx, res)) {
                    ret = JS_FALSE;
                    goto done;
                }
                break;
            case special_some:
            case special_some | special_TA:
                if (JS_ToBoolFree(ctx, res)) {
                    ret = JS_TRUE;
                    goto done;
                }
                break;
            case special_map:
                if (JS_DefinePropertyValueInt64(ctx, ret, k, res,
                                                JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                    goto exception;
                break;
            case special_map | special_TA:
                if (JS_SetPropertyValue(ctx, ret, JS_NewInt32(ctx, k), res, JS_PROP_THROW) < 0)
                    goto exception;
                break;
            case special_filter:
            case special_filter | special_TA:
                if (JS_ToBoolFree(ctx, res)) {
                    if (JS_DefinePropertyValueInt64(ctx, ret, n++, JS_DupValue(ctx, val),
                                                    JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                        goto exception;
                }
                break;
            default:
                JS_FreeValue(ctx, res);
                break;
            }
            JS_FreeValue(ctx, val);
            val = JS_UNDEFINED;
        }
    }
done:
    if (special == (special_filter | special_TA)) {
        JSValue arr;
        args[0] = obj;
        args[1] = JS_NewInt32(ctx, n);
        arr = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 2, args);
        if (JS_IsException(arr))
            goto exception;
        args[0] = ret;
        res = JS_Invoke(ctx, arr, JS_ATOM_set, 1, args);
        if (check_exception_free(ctx, res))
            goto exception;
        JS_FreeValue(ctx, ret);
        ret = arr;
    }
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return ret;

exception:
    JS_FreeValue(ctx, ret);
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}